

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

bool __thiscall IMLE::validInverseSolutions(IMLE *this,int *newSol1,int *newSol2,int *worseSol)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  bool bVar4;
  int *piVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  double *val;
  char *pmessage;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_R8;
  longdouble *in_R9;
  Index othersize;
  long lVar11;
  long lVar12;
  double *pdVar13;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar14;
  double dVar15;
  Z *pZVar16;
  double dVar17;
  Z aux;
  Vec T;
  Vec sumWsq;
  scalar_sum_op<double,_double> local_171;
  longdouble local_170;
  double local_160;
  longdouble local_158;
  double *local_148;
  long lStack_140;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_138;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_128;
  longdouble local_118;
  int *local_108;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_100;
  undefined1 local_d8 [24];
  variable_if_dynamic<long,__1> local_c0;
  Mat *local_b8;
  scalar_constant_op<double> local_b0;
  variable_if_dynamic<long,__1> local_a8;
  variable_if_dynamic<long,__1> local_a0;
  Mat *local_90;
  variable_if_dynamic<long,__1> local_88;
  variable_if_dynamic<long,__1> local_80;
  void *local_78;
  double local_60;
  int *local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  lVar11 = (long)this->nInvSolFound;
  local_138.m_storage.m_data = (double *)0x0;
  local_138.m_storage.m_rows = 0;
  local_58 = newSol2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_138,lVar11,1);
  if (local_138.m_storage.m_rows != lVar11) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_138,lVar11,1);
  }
  if (0 < local_138.m_storage.m_rows) {
    memset(local_138.m_storage.m_data,0,local_138.m_storage.m_rows << 3);
  }
  lVar11 = (long)this->nInvSolFound;
  local_128.m_storage.m_data = (double *)0x0;
  local_128.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_128,lVar11,1);
  if (local_128.m_storage.m_rows != lVar11) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_128,lVar11,1);
  }
  if (0 < local_128.m_storage.m_rows) {
    memset(local_128.m_storage.m_data,0,local_128.m_storage.m_rows << 3);
  }
  iVar1 = this->M;
  if (0 < (long)iVar1) {
    piVar3 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar13 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    in_R8 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
             *)&(((this->experts).
                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  .
                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).p_x_Norm;
    in_R9 = (longdouble *)0x0;
    do {
      iVar2 = piVar3[(long)in_R9];
      local_138.m_storage.m_data[iVar2] = pdVar13[(long)in_R9] + local_138.m_storage.m_data[iVar2];
      local_128.m_storage.m_data[iVar2] =
           *(double *)in_R8 * *(double *)in_R8 + local_128.m_storage.m_data[iVar2];
      in_R9 = (longdouble *)((long)in_R9 + 1);
      in_R8 = in_R8 + 0x308;
    } while ((longdouble *)(long)iVar1 != in_R9);
  }
  *worseSol = -1;
  local_108 = newSol1;
  if (this->nInvSolFound < 1) {
    local_160 = -1.0;
  }
  else {
    lVar12 = 0;
    local_158 = (longdouble)1.79769313486232e+308;
    lVar11 = 0;
    pdVar13 = (double *)0x0;
    local_160 = -1.0;
    do {
      local_d8._0_8_ =
           (long)&(((this->invPredictions).
                    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
           lVar11;
      local_d8._16_8_ =
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
      local_d8._8_8_ =
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data + local_d8._16_8_ * (long)pdVar13;
      local_b0.m_other = 0.0;
      dVar15 = 0.0;
      local_b8 = &this->sumInvRzj;
      local_a8.m_value = (long)pdVar13;
      local_a0.m_value = local_d8._16_8_;
      if ((void *)local_d8._16_8_ != (void *)0x0) {
        local_100.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (((Z *)local_d8._0_8_)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             .m_storage.m_data;
        local_100.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_outerStride.m_value =
             (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        local_100.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_data = (PointerType)local_d8._8_8_;
        dVar15 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>,3,0>
                 ::
                 run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                           (&local_100,(scalar_sum_op<double,_double> *)&local_148,
                            (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                             *)local_d8);
      }
      dVar17 = local_138.m_storage.m_data[(long)pdVar13];
      local_138.m_storage.m_data[(long)pdVar13] = dVar17 - dVar15;
      dVar17 = (dVar17 - dVar15) / this->sumAll;
      local_138.m_storage.m_data[(long)pdVar13] = dVar17;
      dVar15 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[(long)pdVar13];
      pZVar16 = (Z *)((double)this->d *
                      ((dVar15 * dVar15) / local_128.m_storage.m_data[(long)pdVar13] + -1.0) + 1.0);
      if ((1.0 <= (double)pZVar16) && (0.0 < dVar17)) {
        local_100.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d._0_8_ = pZVar16;
        if ((undefined1 *)0xffffffffffffe <
            (undefined1 *)
            ((long)&pZVar16[-1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage + 0xfU) &&
            ((long)pZVar16 < 0 ||
            0x3fe < (uint)((ulong)((long)ABS((double)pZVar16) + -0x10000000000000) >> 0x35))) {
          boost::math::policies::detail::raise_error<std::domain_error,double>
                    ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
                     "Degrees of freedom argument is %1%, but must be > 0 !",(double *)&local_100);
        }
        local_d8._0_8_ =
             local_100.
             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
             .
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             .m_d._0_8_;
        pmessage = "Degrees of freedom argument is %1%, but must be > 0 !";
        val = (double *)local_d8;
        if ((undefined1 *)
            ((long)&(((X *)(local_100.
                            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                            .
                            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                            .m_d._0_8_ + -0x10))->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage + 0xfU
            ) < (undefined1 *)0xfffffffffffff ||
            -1 < (long)local_100.
                       super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                       .
                       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                       .m_d._0_8_ &&
            (uint)((local_100.
                    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                    .
                    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                    .m_d._0_8_ & 0x7fffffffffffffff) + 0xfff0000000000000 >> 0x35) < 0x3ff) {
          dVar15 = *(double *)((long)local_138.m_storage.m_data + lVar12);
          if ((0x3fe < (uint)((ulong)((long)ABS(dVar15) + -0x10000000000000) >> 0x35) ||
              (long)dVar15 < 0) && (ABS(dVar15) != 0.0 && 0xffffffffffffe < (long)dVar15 - 1U)) {
            val = (double *)((long)local_138.m_storage.m_data + lVar12);
            pmessage = "Chi Square parameter was %1%, but must be > 0 !";
            goto LAB_0014d12b;
          }
          local_38 = (double)local_100.
                             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                             .
                             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                             .m_d._0_8_ * 0.5;
          local_40 = dVar15 * 0.5;
          boost::math::detail::
          gamma_incomplete_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((longdouble *)0x1,(detail *)0x0,(longdouble)local_38,(longdouble)local_40,
                     SUB81(&local_148,0),false,in_R8,in_R9);
          local_118 = ABS(in_ST0);
          dVar15 = 0.0;
          lVar6 = in_ST1;
          lVar7 = in_ST2;
          lVar8 = in_ST3;
          lVar9 = in_ST4;
          lVar10 = in_ST5;
          local_170 = in_ST0;
          if (local_158 < local_118) {
            lVar14 = in_ST5;
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("gamma_p<%1%>(%1%, %1%)","numeric overflow");
            dVar15 = (double)local_170;
            lVar6 = in_ST1;
            lVar7 = in_ST2;
            lVar8 = in_ST3;
            lVar9 = in_ST4;
            lVar10 = in_ST5;
            in_ST5 = lVar14;
            local_48 = dVar15;
          }
          in_ST4 = lVar10;
          in_ST3 = lVar9;
          in_ST2 = lVar8;
          in_ST1 = lVar7;
          in_ST0 = lVar6;
          local_50 = (double)local_170;
          if (local_118 <= local_158) {
            dVar15 = local_50;
          }
        }
        else {
LAB_0014d12b:
          boost::math::policies::detail::raise_error<std::domain_error,double>
                    (boost::math::
                     cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
                     ::function,pmessage,val);
          dVar15 = NAN;
        }
        if (local_160 <= dVar15) {
          *worseSol = (int)pdVar13;
          local_160 = dVar15;
        }
      }
      pdVar13 = (double *)((long)pdVar13 + 1);
      lVar11 = lVar11 + 0x10;
      lVar12 = lVar12 + 8;
    } while ((long)pdVar13 < (long)this->nInvSolFound);
  }
  dVar15 = (this->param).multiValuedSignificance;
  if (dVar15 < local_160) {
    local_148 = (double *)0x0;
    lStack_140 = 0;
    local_60 = dVar15;
    if (0 < this->M) {
      local_170 = (longdouble)CONCAT28(local_170._8_2_,0xbff0000000000000);
      lVar12 = 0;
      lVar11 = 0;
      do {
        if ((this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] == *worseSol) {
          local_d8._0_8_ =
               (long)&(((this->iInvRj).
                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                      m_data + lVar12;
          local_d8._8_8_ =
               (this->invPredictions).
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + *worseSol;
          local_c0.m_value =
               (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
          local_a8.m_value =
               (long)((this->invRzj).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data + local_c0.m_value * lVar11);
          local_b0.m_other = 2.0;
          local_88.m_value = 0;
          local_a0.m_value = local_c0.m_value;
          local_90 = &this->invRzj;
          local_80.m_value = lVar11;
          local_78 = (void *)local_c0.m_value;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)&local_148,
                     (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                      *)local_d8,(assign_op<double,_double> *)&local_100);
          dVar15 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[lVar11];
          local_100.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d._0_8_ = (this->invPredictions).
                       super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + *worseSol;
          local_100.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)&local_148;
          if (lStack_140 == 0) {
            dVar17 = 0.0;
          }
          else {
            local_158 = (longdouble)CONCAT28(local_158._8_2_,dVar15);
            local_d8._8_8_ =
                 (((Z *)local_100.
                        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                        .
                        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                        .m_d._0_8_)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 .m_storage.m_data;
            local_d8._16_8_ = local_148;
            dVar17 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_d8,&local_171,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                 *)&local_100);
            dVar15 = local_158._0_8_;
          }
          if (local_170._0_8_ < dVar15 + dVar17) {
            *local_108 = (int)lVar11;
            local_170 = (longdouble)CONCAT28(local_170._8_2_,dVar15 + dVar17);
          }
        }
        lVar11 = lVar11 + 1;
        lVar12 = lVar12 + 0x18;
      } while (lVar11 < this->M);
    }
    piVar5 = local_108;
    if (0 < this->M) {
      local_118 = (longdouble)CONCAT28(local_118._8_2_,&this->invRzj);
      local_170 = (longdouble)CONCAT28(local_170._8_2_,0xbff0000000000000);
      lVar12 = 0;
      lVar11 = 0;
      do {
        if ((this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] == *worseSol) {
          local_d8._0_8_ =
               (long)&(((this->iInvRj).
                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                      m_data + lVar12;
          local_d8._8_8_ =
               &(this->experts).
                super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                .
                super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                ._M_impl.super__Vector_impl_data._M_start[*piVar5].super_LinearExpert.pred_z;
          local_c0.m_value =
               (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
          local_a8.m_value =
               (long)((this->invRzj).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data + local_c0.m_value * lVar11);
          local_b0.m_other = 2.0;
          local_90 = local_118._0_8_;
          local_88.m_value = 0;
          local_a0.m_value = local_c0.m_value;
          local_80.m_value = lVar11;
          local_78 = (void *)local_c0.m_value;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)&local_148,
                     (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                      *)local_d8,(assign_op<double,_double> *)&local_100);
          dVar15 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[lVar11];
          local_100.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d._0_8_ = &(this->experts).
                        super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                        .
                        super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                        ._M_impl.super__Vector_impl_data._M_start[*piVar5].super_LinearExpert.pred_z
          ;
          local_100.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)&local_148;
          if (lStack_140 == 0) {
            dVar17 = 0.0;
          }
          else {
            local_158 = (longdouble)CONCAT28(local_158._8_2_,dVar15);
            local_d8._8_8_ =
                 (((Z *)local_100.
                        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                        .
                        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                        .m_d._0_8_)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 .m_storage.m_data;
            local_d8._16_8_ = local_148;
            dVar17 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_d8,&local_171,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                 *)&local_100);
            dVar15 = local_158._0_8_;
          }
          if (local_170._0_8_ < dVar15 + dVar17) {
            *local_58 = (int)lVar11;
            local_170 = (longdouble)CONCAT28(local_170._8_2_,dVar15 + dVar17);
          }
        }
        lVar11 = lVar11 + 1;
        lVar12 = lVar12 + 0x18;
      } while (lVar11 < this->M);
    }
    free(local_148);
    dVar15 = local_60;
  }
  bVar4 = local_160 <= dVar15;
  free(local_128.m_storage.m_data);
  free(local_138.m_storage.m_data);
  return bVar4;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validInverseSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    Vec T = Vec::Zero(nInvSolFound);
    Vec sumWsq = Vec::Zero(nInvSolFound);
    for(int j = 0; j < M; j++)
    {
        T(sNearestInv[j]) += zInvRzj(j);
        sumWsq(sNearestInv[j]) += experts[j].get_p_x()*experts[j].get_p_x();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;
    for(int k = 0; k < nInvSolFound; k++)
    {
        T(k) -= invPredictions[k].dot( sumInvRzj.col(k) );
        T(k) /= (sumAll);

        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k) - 1.0) * d;
//        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k)) * d;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dist, dMax = -1.0;
        Z aux;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * invPredictions[worseSol] - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + invPredictions[worseSol].dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol1 = j;
            }
        }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * experts[newSol1].getPredZ() - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + experts[newSol1].getPredZ().dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol2 = j;
            }
        }

        return false;
    }
}